

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen_s.c
# Opt level: O0

errno_t fopen_s(FILE **streamptr,char *filename,char *mode)

{
  FILE *pFVar1;
  int *piVar2;
  char *mode_local;
  char *filename_local;
  FILE **streamptr_local;
  
  if (((streamptr == (FILE **)0x0) || (filename == (char *)0x0)) || (mode == (char *)0x0)) {
    if (streamptr != (FILE **)0x0) {
      *streamptr = (FILE *)0x0;
    }
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
    streamptr_local._4_4_ = 0x16;
  }
  else {
    pFVar1 = fopen(filename,mode);
    *streamptr = (FILE *)pFVar1;
    if (pFVar1 == (FILE *)0x0) {
      piVar2 = _PDCLIB_errno_func();
      streamptr_local._4_4_ = *piVar2;
    }
    else {
      streamptr_local._4_4_ = 0;
    }
  }
  return streamptr_local._4_4_;
}

Assistant:

errno_t fopen_s( FILE * _PDCLIB_restrict * _PDCLIB_restrict streamptr, const char * _PDCLIB_restrict filename, const char * _PDCLIB_restrict mode )
{
    if ( streamptr == NULL || filename == NULL || mode == NULL )
    {
        if ( streamptr != NULL )
        {
            *streamptr = NULL;
        }

        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return _PDCLIB_EINVAL;
    }

    if ( ( *streamptr = fopen( filename, mode ) ) == NULL )
    {
        return *_PDCLIB_errno_func();
    }

    return 0;
}